

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay2.c
# Opt level: O2

void ConvertRGBtoYV12(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  ushort *puVar1;
  Uint8 **ppUVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  Uint8 *rgb;
  Uint8 *pUVar8;
  int yuv [3];
  Uint8 *local_50;
  Uint8 local_44 [4];
  Uint8 local_40;
  Uint8 local_3c;
  Uint8 *local_38;
  
  SDL_LockSurface();
  SDL_LockYUVOverlay(o);
  uVar5 = 0;
  while ((uVar4 = (uint)uVar5, (int)uVar4 < s->h && ((int)uVar4 < o->h))) {
    rgb = (Uint8 *)((ulong)(s->pitch * uVar4) + (long)s->pixels);
    puVar1 = o->pitches;
    ppUVar2 = o->pixels;
    iVar3 = (int)(uVar5 >> 1);
    local_50 = ppUVar2[1] + (uint)puVar1[1] * iVar3;
    pUVar8 = ppUVar2[2] + (uint)puVar1[2] * iVar3;
    local_38 = *ppUVar2 + *puVar1 * uVar4;
    for (lVar7 = 0; (uVar6 = (uint)lVar7, (int)uVar6 < s->w && ((int)uVar6 < o->w));
        lVar7 = lVar7 + 1) {
      RGBtoYUV(rgb,(int *)local_44,monochrome,luminance);
      local_38[lVar7] = local_44[0];
      if (((uVar6 | uVar4) & 1) == 0) {
        *local_50 = local_3c;
        local_50 = local_50 + 1;
        *pUVar8 = local_40;
        pUVar8 = pUVar8 + 1;
      }
      rgb = rgb + s->format->BytesPerPixel;
    }
    uVar5 = (ulong)(uVar4 + 1);
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoYV12(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op[3];

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	/* Convert */
	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op[0]=o->pixels[0]+o->pitches[0]*y;
		op[1]=o->pixels[1]+o->pitches[1]*(y/2);
		op[2]=o->pixels[2]+o->pitches[2]*(y/2);
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p, yuv, monochrome, luminance);
			*(op[0]++)=yuv[0];
			if(x%2==0 && y%2==0)
			{
				*(op[1]++)=yuv[2];
				*(op[2]++)=yuv[1];
			}
			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}